

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Memory> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
          (RefPtr<wabt::interp::Memory> *__return_storage_ptr__,Store *this,Store *args,
          MemoryType *args_1)

{
  Memory *this_00;
  Ref ref;
  Memory *local_60;
  MemoryType local_58;
  
  this_00 = (Memory *)operator_new(0x88);
  local_58.super_ExternType.kind = (args_1->super_ExternType).kind;
  local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002c8bc0;
  local_58.limits.has_max = (args_1->limits).has_max;
  local_58.limits.is_shared = (args_1->limits).is_shared;
  local_58.limits._18_6_ = *(undefined6 *)&(args_1->limits).field_0x12;
  local_58.limits.initial = (args_1->limits).initial;
  local_58.limits.max = (args_1->limits).max;
  Memory::Memory(this_00,args,&local_58);
  local_60 = this_00;
  ref.index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
              ::New<wabt::interp::Memory*>
                        ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                          *)&this->objects_,&local_60);
  RefPtr<wabt::interp::Memory>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}